

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O1

void av1_highbd_quantize_dc_facade
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,MACROBLOCK_PLANE *p,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,uint16_t *eob_ptr,SCAN_ORDER *sc,QUANT_PARAM *qparam)

{
  short sVar1;
  short sVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  short *psVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  size_t __n;
  
  pbVar4 = qparam->qmatrix;
  pbVar5 = qparam->iqmatrix;
  psVar6 = p->round_QTX;
  sVar1 = *p->quant_fp_QTX;
  sVar2 = *p->dequant_QTX;
  iVar3 = qparam->log_scale;
  __n = (long)(int)n_coeffs << 2;
  memset(qcoeff_ptr,0,__n);
  memset(dqcoeff_ptr,0,__n);
  if (pbVar4 == (byte *)0x0) {
    uVar9 = 0x20;
  }
  else {
    uVar9 = (ulong)*pbVar4;
  }
  if (pbVar5 == (byte *)0x0) {
    uVar11 = 0x20;
  }
  else {
    uVar11 = (uint)*pbVar5;
  }
  uVar7 = *coeff_ptr >> 0x1f;
  bVar10 = (byte)iVar3;
  uVar8 = (uint)((long)(uVar9 * (long)sVar1 *
                       (long)(int)((((1 << (bVar10 & 0x1f)) >> 1) + (int)*psVar6 >> (bVar10 & 0x1f))
                                  + ((*coeff_ptr ^ uVar7) - uVar7))) >> (0x15 - bVar10 & 0x3f));
  *qcoeff_ptr = (uVar7 ^ uVar8) - uVar7;
  *dqcoeff_ptr = ((int)(((int)(uVar11 * (int)sVar2 + 0x10) >> 5) * uVar8) >> (bVar10 & 0x1f) ^ uVar7
                 ) - uVar7;
  *eob_ptr = (ushort)(uVar8 != 0);
  return;
}

Assistant:

void av1_highbd_quantize_dc_facade(const tran_low_t *coeff_ptr,
                                   intptr_t n_coeffs, const MACROBLOCK_PLANE *p,
                                   tran_low_t *qcoeff_ptr,
                                   tran_low_t *dqcoeff_ptr, uint16_t *eob_ptr,
                                   const SCAN_ORDER *sc,
                                   const QUANT_PARAM *qparam) {
  // obsolete skip_block
  const int skip_block = 0;
  const qm_val_t *qm_ptr = qparam->qmatrix;
  const qm_val_t *iqm_ptr = qparam->iqmatrix;
  (void)sc;

  highbd_quantize_dc(coeff_ptr, (int)n_coeffs, skip_block, p->round_QTX,
                     p->quant_fp_QTX[0], qcoeff_ptr, dqcoeff_ptr,
                     p->dequant_QTX[0], eob_ptr, qm_ptr, iqm_ptr,
                     qparam->log_scale);
}